

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void worker(void *arg)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  while( true ) {
    uv_mutex_lock(&mutex);
    while (pvVar2 = wq[0], (void **)wq[0] == wq) {
      idle_threads = idle_threads + 1;
      uv_cond_wait(&cond,&mutex);
      idle_threads = idle_threads - 1;
    }
    if ((void **)wq[0] == exit_message) {
      uv_cond_signal(&cond);
    }
    else {
      **(undefined8 **)((long)wq[0] + 8) = *wq[0];
      *(undefined8 *)(*pvVar2 + 8) = *(undefined8 *)((long)pvVar2 + 8);
      *(void **)pvVar2 = pvVar2;
      *(void **)((long)pvVar2 + 8) = pvVar2;
    }
    uv_mutex_unlock(&mutex);
    if ((void **)pvVar2 == exit_message) break;
    (**(code **)((long)pvVar2 + -0x18))((long)pvVar2 + -0x18);
    uv_mutex_lock((uv_mutex_t *)(*(long *)((long)pvVar2 + -8) + 0x88));
    *(undefined8 *)((long)pvVar2 + -0x18) = 0;
    *(long *)pvVar2 = *(long *)((long)pvVar2 + -8) + 0x78;
    puVar1 = *(undefined8 **)(*(long *)((long)pvVar2 + -8) + 0x80);
    *(undefined8 **)((long)pvVar2 + 8) = puVar1;
    *puVar1 = pvVar2;
    *(void **)(*(long *)((long)pvVar2 + -8) + 0x80) = pvVar2;
    uv_async_send((uv_async_t *)(*(long *)((long)pvVar2 + -8) + 0xb0));
    uv_mutex_unlock((uv_mutex_t *)(*(long *)((long)pvVar2 + -8) + 0x88));
  }
  return;
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  QUEUE* q;

  (void) arg;

  for (;;) {
    uv_mutex_lock(&mutex);

    while (QUEUE_EMPTY(&wq)) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = QUEUE_HEAD(&wq);

    if (q == &exit_message)
      uv_cond_signal(&cond);
    else {
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);  /* Signal uv_cancel() that the work req is
                             executing. */
    }

    uv_mutex_unlock(&mutex);

    if (q == &exit_message)
      break;

    w = QUEUE_DATA(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    QUEUE_INSERT_TAIL(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);
  }
}